

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O2

QThread * __thiscall QNetworkAccessManagerPrivate::createThread(QNetworkAccessManagerPrivate *this)

{
  QThread *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->thread;
  if (pQVar1 == (QThread *)0x0) {
    pQVar1 = (QThread *)operator_new(0x10);
    QThread::QThread(pQVar1,(QObject *)0x0);
    this->thread = pQVar1;
    local_40.d = (Data *)0x0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_40.ptr = L"QNetworkAccessManager thread";
    local_58.size = 0;
    local_40.size = 0x1c;
    QObject::doSetObjectName((QString *)pQVar1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QThread::start(this->thread,7);
    pQVar1 = this->thread;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QThread * QNetworkAccessManagerPrivate::createThread()
{
    if (!thread) {
        thread = new QThread;
        thread->setObjectName(QStringLiteral("QNetworkAccessManager thread"));
        thread->start();
    }
    Q_ASSERT(thread);
    return thread;
}